

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O2

Session * __thiscall SessionManager::getSession(SessionManager *this,CK_SESSION_HANDLE hSession)

{
  pointer ppSVar1;
  Session *pSVar2;
  MutexLocker lock;
  MutexLocker local_20;
  
  MutexLocker::MutexLocker(&local_20,this->sessionsMutex);
  if ((hSession == 0) ||
     (ppSVar1 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
                super__Vector_impl_data._M_start,
     (ulong)((long)(this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) < hSession)) {
    pSVar2 = (Session *)0x0;
  }
  else {
    pSVar2 = ppSVar1[hSession - 1];
  }
  MutexLocker::~MutexLocker(&local_20);
  return pSVar2;
}

Assistant:

Session* SessionManager::getSession(CK_SESSION_HANDLE hSession)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// We do not want to get a negative number below
	if (hSession == CK_INVALID_HANDLE) return NULL;

	// Check if we are out of range
	if (hSession > sessions.size()) return NULL;

	return sessions[hSession - 1];
}